

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O3

void __thiscall HostVector_copy_Test::TestBody(HostVector_copy_Test *this)

{
  pointer pvVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  char *message;
  value_type_conflict2 v;
  AssertionResult gtest_ar;
  void *ptr;
  Message local_98;
  float local_8c;
  internal local_88 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  AssertHelper local_78;
  pointer local_70;
  void *local_68;
  long local_60;
  Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
  local_50;
  
  iVar4 = posix_memalign(&local_70,0x10,400);
  lVar5 = 0;
  local_50.
  super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
  .pointer_ = (pointer)0x0;
  if (iVar4 == 0) {
    local_50.
    super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
    .pointer_ = local_70;
  }
  local_50.
  super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
  .size_ = 100;
  do {
    pvVar1 = local_50.
             super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
             .pointer_ + lVar5;
    pvVar1[0] = 3.14;
    pvVar1[1] = 3.14;
    pvVar1[2] = 3.14;
    pvVar1[3] = 3.14;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 100);
  memory::
  Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>>
  ::
  Array<memory::Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<16ul>>>>&,void>
            ((Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>>
              *)&local_70,&local_50);
  pvVar2 = local_68;
  if (local_60 != 0) {
    lVar5 = 0;
    do {
      local_8c = *(float *)((long)pvVar2 + lVar5);
      local_98.ss_.ptr_._0_4_ = 0x4048f5c3;
      testing::internal::CmpHelperEQ<float,float>(local_88,"v","3.14f",&local_8c,(float *)&local_98)
      ;
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message(&local_98);
        message = "";
        if (local_80.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((local_80.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
                   ,0x61,message);
        testing::internal::AssertHelper::operator=(&local_78,&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
            (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
           ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar5 = lVar5 + 4;
    } while (local_60 << 2 != lVar5);
  }
  if (local_68 != (void *)0x0) {
    free(local_68);
  }
  if (local_50.
      super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
      .pointer_ != (pointer)0x0) {
    free(local_50.
         super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
         .pointer_);
  }
  return;
}

Assistant:

TEST(HostVector, copy) {
    using namespace memory;

    vecN<float, 16> v16(100);
    v16(memory::all) = 3.14f;
    vecN<float, 32> v32 = v16;

    for(auto v: v32) {
        EXPECT_EQ(v, 3.14f);
    }
}